

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_43::SolverDpllTriadSimd<0>::CountSolutionsConsistentWithPartialAssignment
          (SolverDpllTriadSimd<0> *this,State *state)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int band_idx;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  size_t sVar8;
  State *pSVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  State state_copy;
  undefined1 local_260 [16];
  uint local_244;
  State local_240;
  
  auVar12 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[0][0].configurations.vec);
  auVar13 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[0][1].configurations.vec);
  auVar14 = vpunpcklqdq_avx(auVar12,auVar13);
  auVar12 = vpunpckhqdq_avx(auVar12,auVar13);
  auVar12 = vpaddq_avx(auVar14,auVar12);
  auVar14 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[0][2].configurations.vec);
  auVar15 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[1][0].configurations.vec);
  auVar13 = vpunpcklqdq_avx(auVar14,auVar15);
  auVar14 = vpunpckhqdq_avx(auVar14,auVar15);
  auVar14 = vpaddq_avx(auVar13,auVar14);
  auVar13 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[1][1].configurations.vec);
  auVar16 = vpopcntq_avx512_vpopcntdq(*(undefined1 (*) [16])state->bands[1][2].configurations.vec);
  auVar15 = vpunpcklqdq_avx(auVar13,auVar16);
  auVar13 = vpunpckhqdq_avx(auVar13,auVar16);
  auVar13 = vpaddq_avx(auVar15,auVar13);
  auVar15 = vpcmpeqd_avx(auVar16,auVar16);
  auVar16._8_8_ = 0xf000e00040000;
  auVar16._0_8_ = 0xf000e00040000;
  auVar15 = vpermi2w_avx512vl(auVar16,auVar12,auVar15);
  auVar12 = vpmovsxbw_avx(ZEXT816(0x70600000c080100));
  auVar14 = vpermi2w_avx512vl(auVar12,auVar15,auVar14);
  auVar12 = vpmovsxbw_avx(ZEXT816(0x7060c0803020100));
  auVar12 = vpermi2w_avx512vl(auVar12,auVar14,auVar13);
  auVar14._8_2_ = 0xfff6;
  auVar14._0_8_ = 0xfff6fff6fff6fff6;
  auVar14._10_2_ = 0xfff6;
  auVar14._12_2_ = 0xfff6;
  auVar14._14_2_ = 0xfff6;
  auVar12 = vpaddw_avx(auVar12,auVar14);
  auVar12 = vphminposuw_avx(auVar12);
  if ((auVar12 & (undefined1  [16])0xff00) == (undefined1  [16])0x0) {
    (anonymous_namespace)::SolverDpllTriadSimd<0>::CountSolutionsConsistentWithPartialAssignment();
  }
  else {
    local_244 = 0xffffffff;
    local_240.bands[0][0].configurations.vec[0] = 0;
    local_240.bands[0][0].configurations.vec[1] = 0;
  }
  if (local_244 == 0xffffffff) {
    this->num_solutions_ = this->num_solutions_ + 1;
  }
  else {
    sVar8 = this->num_guesses_ + 1;
    band_idx = *(int *)((anonymous_namespace)::tables + (ulong)local_244 * 4 + 0x18dc);
    local_260._8_8_ = local_240.bands[0][0].configurations.vec[1];
    local_260._0_8_ = local_240.bands[0][0].configurations.vec[0];
    if (local_244 < 3) {
      auVar12 = *(undefined1 (*) [16])state->bands[0][band_idx].configurations.vec;
      this->num_guesses_ = sVar8;
      bVar7 = false;
      lVar10 = 0;
      pSVar9 = &local_240;
      do {
        lVar11 = 0x10;
        do {
          puVar1 = (undefined8 *)((long)state->bands[lVar10 + -1][2].eliminations.vec + lVar11);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar9->bands + -1) + 0x50 + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          puVar1 = (undefined8 *)((long)state->bands[lVar10][0].configurations.vec + lVar11);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar9->bands[0][0].configurations.vec + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0x70);
        lVar10 = 1;
        bVar6 = !bVar7;
        bVar7 = true;
        pSVar9 = (State *)(local_240.bands + 1);
      } while (bVar6);
      memcpy(local_240.boxen,state->boxen,0x120);
      auVar12 = vpand_avx(auVar12,local_260);
      uVar3 = vpcmpgtq_avx512vl(auVar12,(undefined1  [16])0x0);
      auVar14 = vpcmpgtq_avx(auVar12,(undefined1  [16])0x0);
      auVar14 = vpslldq_avx(auVar14,1);
      auVar4._8_8_ = 1;
      auVar4._0_8_ = 1;
      auVar14 = vandnpd_avx512vl(auVar14,auVar4);
      auVar14 = vpsubq_avx512vl(auVar12,auVar14);
      bVar7 = (bool)((byte)(uVar3 & 3) & 1);
      auVar17._0_8_ = (ulong)bVar7 * auVar14._0_8_ | (ulong)!bVar7 * auVar12._0_8_;
      uVar3 = (uVar3 & 3) >> 1;
      auVar17._8_8_ = uVar3 * auVar14._8_8_ | (ulong)!SUB81(uVar3,0) * auVar12._8_8_;
      auVar14 = vpand_avx(auVar17,auVar12);
      auVar13 = vpor_avx(auVar14,*(undefined1 (*) [16])local_240.bands[0][band_idx].eliminations.vec
                        );
      *(undefined1 (*) [16])local_240.bands[0][band_idx].eliminations.vec = auVar13;
      bVar7 = BandEliminate<0>(&local_240,band_idx,0);
      if ((bVar7) &&
         (CountSolutionsConsistentWithPartialAssignment(this,&local_240),
         this->num_solutions_ == this->limit_)) {
        return;
      }
      auVar12 = vpternlogq_avx512vl(auVar12,auVar14,
                                    *(undefined1 (*) [16])state->bands[0][band_idx].eliminations.vec
                                    ,0xbe);
      *(undefined1 (*) [16])state->bands[0][band_idx].eliminations.vec = auVar12;
      bVar7 = BandEliminate<0>(state,band_idx,0);
    }
    else {
      auVar12 = *(undefined1 (*) [16])state->boxen[(long)band_idx + -3].cells.vec;
      this->num_guesses_ = sVar8;
      bVar7 = false;
      lVar10 = 0;
      pSVar9 = &local_240;
      do {
        lVar11 = 0x10;
        do {
          puVar1 = (undefined8 *)((long)state->bands[lVar10 + -1][2].eliminations.vec + lVar11);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)(pSVar9->bands + -1) + 0x50 + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          puVar1 = (undefined8 *)((long)state->bands[lVar10][0].configurations.vec + lVar11);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)pSVar9->bands[0][0].configurations.vec + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0x70);
        lVar10 = 1;
        bVar6 = !bVar7;
        bVar7 = true;
        pSVar9 = (State *)(local_240.bands + 1);
      } while (bVar6);
      memcpy(local_240.boxen,state->boxen,0x120);
      auVar12 = vpand_avx(auVar12,local_260);
      uVar3 = vpcmpgtq_avx512vl(auVar12,(undefined1  [16])0x0);
      auVar14 = vpcmpgtq_avx(auVar12,(undefined1  [16])0x0);
      auVar14 = vpslldq_avx(auVar14,1);
      auVar13._8_8_ = 1;
      auVar13._0_8_ = 1;
      auVar14 = vandnpd_avx512vl(auVar14,auVar13);
      auVar14 = vpsubq_avx512vl(auVar12,auVar14);
      bVar7 = (bool)((byte)(uVar3 & 3) & 1);
      auVar15._0_8_ = (ulong)bVar7 * auVar14._0_8_ | (ulong)!bVar7 * auVar12._0_8_;
      uVar3 = (uVar3 & 3) >> 1;
      auVar15._8_8_ = uVar3 * auVar14._8_8_ | (ulong)!SUB81(uVar3,0) * auVar12._8_8_;
      auVar14 = vpand_avx(auVar15,auVar12);
      auVar13 = vpor_avx(auVar14,*(undefined1 (*) [16])
                                  (local_240.boxen[(long)band_idx + -3].cells.vec + 2));
      *(undefined1 (*) [16])(local_240.boxen[(long)band_idx + -3].cells.vec + 2) = auVar13;
      bVar7 = BandEliminate<1>(&local_240,band_idx,0);
      if ((bVar7) &&
         (CountSolutionsConsistentWithPartialAssignment(this,&local_240),
         this->num_solutions_ == this->limit_)) {
        return;
      }
      auVar12 = vpternlogq_avx512vl(auVar12,auVar14,
                                    *(undefined1 (*) [16])
                                     (state->boxen[(long)band_idx + -3].cells.vec + 2),0xbe);
      *(undefined1 (*) [16])(state->boxen[(long)band_idx + -3].cells.vec + 2) = auVar12;
      bVar7 = BandEliminate<1>(state,band_idx,0);
    }
    if (bVar7 != false) {
      CountSolutionsConsistentWithPartialAssignment(this,state);
    }
  }
  return;
}

Assistant:

void CountSolutionsConsistentWithPartialAssignment(State &state) {
        auto band_and_value = ChooseBandAndValueToBranch(state);
        if (band_and_value.first == NONE) {
            num_solutions_++;
            if (solution_mode == 1 && num_solutions_ == limit_) solution_ = state;
            if (solution_mode == 2) ReportSolution(state);
        } else {
            if (band_and_value.first < 3) {
                BranchOnBandAndValue<0>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            } else {
                BranchOnBandAndValue<1>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            }
        }
    }